

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapetriang.cpp
# Opt level: O1

void pzshape::TPZShapeTriang::Shape
               (TPZVec<double> *pt,TPZVec<long> *id,TPZVec<int> *order,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  uint num;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  int *piVar7;
  long *plVar8;
  int iVar9;
  int xj;
  long lVar10;
  long lVar11;
  ulong uVar12;
  TPZVec<double> *pt_00;
  long lVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  TPZManVector<double,_1> outvec;
  TPZVec<long> ids;
  TPZFNMatrix<50,_double> phin;
  TPZFNMatrix<100,_double> dphin;
  TPZFNMatrix<50,_double> phiblend;
  TPZFNMatrix<100,_double> dphiblend;
  long local_d00;
  long local_ce8;
  long local_cb0;
  TPZVec<double> local_c90;
  double local_c70;
  _func_int **local_c68;
  _func_int **local_c60;
  _func_int **local_c58;
  _func_int **local_c50;
  _func_int **local_c48;
  _func_int **local_c40;
  TPZVec<long> *local_c38;
  TPZVec<double> *local_c30;
  double *local_c28;
  double *local_c20;
  ulong local_c18;
  TPZVec<long> local_c10;
  TPZFMatrix<double> local_bf0;
  double local_b60 [51];
  TPZFMatrix<double> local_9c8;
  double local_938 [101];
  TPZFMatrix<double> local_610;
  double local_580 [51];
  TPZFMatrix<double> local_3e8;
  double local_358 [101];
  
  local_c38 = id;
  local_c30 = pt;
  ShapeCorner(pt,phi,dphi);
  piVar7 = order->fStore;
  if ((((1 < *piVar7) || (1 < piVar7[1])) || (1 < piVar7[2])) || (2 < piVar7[3])) {
    local_610.fElem = local_580;
    local_610.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 7;
    local_610.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
    local_610.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_610.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_c40 = (_func_int **)&PTR__TPZFMatrix_018e0e68;
    local_610.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018e0e68;
    local_610.fSize = 0x32;
    local_610.fGiven = local_610.fElem;
    TPZVec<int>::TPZVec(&local_610.fPivot.super_TPZVec<int>,0);
    local_610.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_610.fPivot.super_TPZVec<int>.fStore = local_610.fPivot.fExtAlloc;
    local_610.fPivot.super_TPZVec<int>.fNElements = 0;
    local_610.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_610.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_610.fWork.fStore = (double *)0x0;
    local_610.fWork.fNElements = 0;
    local_610.fWork.fNAlloc = 0;
    local_c48 = (_func_int **)&PTR__TPZFNMatrix_018e0b78;
    local_610.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_018e0b78;
    local_3e8.fElem = local_358;
    local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
    local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 7;
    local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_c50 = (_func_int **)&PTR__TPZFMatrix_0185f360;
    local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_0185f360;
    local_3e8.fSize = 100;
    pt_00 = (TPZVec<double> *)&local_3e8.fPivot;
    local_3e8.fGiven = local_3e8.fElem;
    TPZVec<int>::TPZVec((TPZVec<int> *)pt_00,0);
    local_3e8.fPivot.super_TPZVec<int>.fStore = local_3e8.fPivot.fExtAlloc;
    local_3e8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_3e8.fPivot.super_TPZVec<int>.fNElements = 0;
    local_3e8.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_3e8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_3e8.fWork.fStore = (double *)0x0;
    local_3e8.fWork.fNElements = 0;
    local_3e8.fWork.fNAlloc = 0;
    local_c58 = (_func_int **)&PTR__TPZFNMatrix_0185f070;
    local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_0185f070;
    lVar13 = 0;
    lVar10 = 0;
    do {
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar10) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((local_610.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar10) ||
         (local_610.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_610.fElem[lVar10] = phi->fElem[lVar10];
      lVar16 = 0;
      do {
        if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar16) ||
           ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar10)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar16) ||
           (local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar10)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        *(undefined8 *)
         ((long)local_3e8.fElem +
         lVar16 * 8 + local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar13) =
             *(undefined8 *)
              ((long)dphi->fElem +
              lVar16 * 8 + (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar13);
        lVar16 = lVar16 + 1;
      } while (lVar16 == 1);
      lVar10 = lVar10 + 1;
      lVar13 = lVar13 + 8;
    } while (lVar10 != 3);
    ShapeGenerating(pt_00,&local_610,&local_3e8);
    local_c20 = local_b60;
    local_c28 = local_938;
    local_d00 = 3;
    local_cb0 = 0x18;
    local_c68 = (_func_int **)&PTR__TPZManVector_018df490;
    local_c60 = (_func_int **)&PTR__TPZVec_0183b5f0;
    uVar15 = 0;
    do {
      dVar1 = (double)(&gRibTrans2dT1d)[uVar15 * 2];
      dVar2 = (double)(&DAT_01a59058)[uVar15 * 2];
      dVar3 = *local_c30->fStore;
      dVar4 = local_c30->fStore[1];
      dVar5 = (double)(&gVet1dT)[uVar15];
      TPZVec<double>::TPZVec(&local_c90,0);
      local_c70 = dVar5 + dVar1 * dVar3 + dVar2 * dVar4;
      local_c90._vptr_TPZVec = local_c68;
      local_c90.fStore = &local_c70;
      local_c90.fNElements = 1;
      local_c90.fNAlloc = 0;
      TPZVec<long>::TPZVec(&local_c10,2);
      plVar8 = local_c38->fStore;
      local_c18 = uVar15 + 1;
      uVar12 = local_c18 & 0xffffffff;
      if (local_c18 == 3) {
        uVar12 = 0;
      }
      *local_c10.fStore = plVar8[uVar15];
      local_c10.fStore[1] = plVar8[uVar12];
      iVar14 = order->fStore[uVar15];
      num = iVar14 - 1;
      lVar10 = (long)(int)num;
      local_bf0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
      local_bf0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_bf0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_bf0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           local_c40;
      local_bf0.fElem = local_c20;
      local_bf0.fGiven = local_c20;
      local_bf0.fSize = 0x32;
      local_bf0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar10;
      TPZVec<int>::TPZVec(&local_bf0.fPivot.super_TPZVec<int>,0);
      local_bf0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
      local_bf0.fPivot.super_TPZVec<int>.fStore = local_bf0.fPivot.fExtAlloc;
      local_bf0.fPivot.super_TPZVec<int>.fNElements = 0;
      local_bf0.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_bf0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
      local_bf0.fWork.fStore = (double *)0x0;
      local_bf0.fWork.fNElements = 0;
      local_bf0.fWork.fNAlloc = 0;
      if (num == 0) {
        local_bf0.fElem = (double *)0x0;
      }
      else if (0x33 < iVar14) {
        local_bf0.fElem = (double *)operator_new__(lVar10 * 8);
      }
      local_bf0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           local_c48;
      local_9c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
      local_9c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_9c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_9c8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           local_c50;
      local_9c8.fElem = local_c28;
      local_9c8.fGiven = local_c28;
      local_9c8.fSize = 100;
      local_9c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar10;
      TPZVec<int>::TPZVec(&local_9c8.fPivot.super_TPZVec<int>,0);
      local_9c8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
      local_9c8.fPivot.super_TPZVec<int>.fStore = local_9c8.fPivot.fExtAlloc;
      local_9c8.fPivot.super_TPZVec<int>.fNElements = 0;
      local_9c8.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_9c8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
      local_9c8.fWork.fStore = (double *)0x0;
      local_9c8.fWork.fNElements = 0;
      local_9c8.fWork.fNAlloc = 0;
      if (num == 0) {
        local_9c8.fElem = (double *)0x0;
      }
      else if (0x33 < iVar14) {
        local_9c8.fElem = (double *)operator_new__(lVar10 << 4);
      }
      local_9c8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           local_c58;
      iVar6 = order->fStore[uVar15];
      iVar9 = TPZShapeLinear::GetTransformId1d(&local_c10);
      TPZShapeLinear::ShapeInternal(&local_c90,iVar6,&local_bf0,&local_9c8,iVar9);
      TransformDerivativeFromRibToTriang((int)uVar15,num,&local_9c8);
      if (1 < iVar14) {
        lVar10 = uVar15 + 3;
        local_d00 = (long)(int)local_d00;
        lVar13 = local_d00 * 8;
        lVar16 = 0;
        uVar12 = 0;
        do {
          if ((local_610.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar10) ||
             (local_610.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((local_bf0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar12) ||
             (local_bf0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (((local_d00 < 0) ||
              ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= local_d00)) ||
             ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          phi->fElem[local_d00] = local_610.fElem[uVar15 + 3] * local_bf0.fElem[uVar12];
          lVar11 = 0;
          do {
            if ((local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar11) ||
               (local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar10)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_bf0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar12) ||
               (local_bf0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_610.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar10) ||
               (local_610.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_9c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar11) ||
               (local_9c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar12)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar11) ||
                (local_d00 < 0)) ||
               ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= local_d00)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            *(double *)
             ((long)dphi->fElem +
             lVar11 * 8 + (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar13) =
                 *(double *)
                  ((long)local_3e8.fElem +
                  lVar11 * 8 +
                  local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * local_cb0) *
                 local_bf0.fElem[uVar12] +
                 local_610.fElem[uVar15 + 3] *
                 *(double *)
                  ((long)local_9c8.fElem +
                  lVar11 * 8 + local_9c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar16);
            lVar11 = lVar11 + 1;
          } while (lVar11 == 1);
          local_d00 = local_d00 + 1;
          uVar12 = uVar12 + 1;
          lVar16 = lVar16 + 8;
          lVar13 = lVar13 + 8;
        } while (uVar12 != num);
      }
      TPZFMatrix<double>::~TPZFMatrix(&local_9c8,&PTR_PTR_0185f328);
      TPZFMatrix<double>::~TPZFMatrix(&local_bf0,&PTR_PTR_018e0e30);
      local_c10._vptr_TPZVec = local_c60;
      if (local_c10.fStore != (long *)0x0) {
        operator_delete__(local_c10.fStore);
      }
      if (local_c90.fStore == &local_c70) {
        local_c90.fStore = (double *)0x0;
      }
      local_c90.fNAlloc = 0;
      local_c90._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
      if (local_c90.fStore != (double *)0x0) {
        operator_delete__(local_c90.fStore);
      }
      local_cb0 = local_cb0 + 8;
      uVar15 = local_c18;
    } while (local_c18 != 3);
    iVar14 = order->fStore[3];
    if (2 < iVar14) {
      iVar14 = (iVar14 + -1) * (iVar14 + -2);
      lVar10 = (long)(iVar14 / 2);
      local_bf0.fElem = local_b60;
      local_bf0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
      local_bf0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_bf0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_bf0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           local_c40;
      local_bf0.fSize = 0x32;
      local_bf0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar10;
      local_bf0.fGiven = local_bf0.fElem;
      TPZVec<int>::TPZVec(&local_bf0.fPivot.super_TPZVec<int>,0);
      local_bf0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
      local_bf0.fPivot.super_TPZVec<int>.fStore = local_bf0.fPivot.fExtAlloc;
      local_bf0.fPivot.super_TPZVec<int>.fNElements = 0;
      local_bf0.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_bf0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
      local_bf0.fWork.fStore = (double *)0x0;
      local_bf0.fWork.fNElements = 0;
      local_bf0.fWork.fNAlloc = 0;
      if (iVar14 + 1U < 3) {
        local_bf0.fElem = (double *)0x0;
      }
      else if (0x65 < iVar14) {
        local_bf0.fElem = (double *)operator_new__(lVar10 * 8);
      }
      local_bf0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           local_c48;
      local_9c8.fElem = local_938;
      local_9c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
      local_9c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_9c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_9c8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           local_c50;
      local_9c8.fSize = 100;
      local_9c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar10;
      local_9c8.fGiven = local_9c8.fElem;
      TPZVec<int>::TPZVec(&local_9c8.fPivot.super_TPZVec<int>,0);
      local_9c8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
      local_9c8.fPivot.super_TPZVec<int>.fStore = local_9c8.fPivot.fExtAlloc;
      local_9c8.fPivot.super_TPZVec<int>.fNElements = 0;
      local_9c8.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_9c8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
      local_9c8.fWork.fStore = (double *)0x0;
      local_9c8.fWork.fNElements = 0;
      local_9c8.fWork.fNAlloc = 0;
      if (iVar14 + 1U < 3) {
        local_9c8.fElem = (double *)0x0;
      }
      else if (0x65 < iVar14) {
        local_9c8.fElem = (double *)operator_new__(lVar10 << 4);
      }
      local_9c8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           local_c58;
      iVar6 = order->fStore[3];
      iVar9 = GetTransformId2dT(local_c38);
      ShapeInternal(local_c30,iVar6 + -2,&local_bf0,&local_9c8,iVar9);
      if (1 < iVar14) {
        local_d00 = (long)(int)local_d00;
        local_cb0 = local_d00 * 8;
        local_ce8 = 0;
        lVar13 = 0;
        do {
          if ((local_610.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 7) ||
             (local_610.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((local_bf0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar13) ||
             (local_bf0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (((local_d00 < 0) ||
              ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= local_d00)) ||
             ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          phi->fElem[local_d00] = local_610.fElem[6] * local_bf0.fElem[lVar13];
          lVar16 = 0;
          do {
            if ((local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar16) ||
               (local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 7)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_bf0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar13) ||
               (local_bf0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_610.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 7) ||
               (local_610.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_9c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar16) ||
               (local_9c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar13)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar16) ||
                (local_d00 < 0)) ||
               ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= local_d00)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            *(double *)
             ((long)dphi->fElem +
             lVar16 * 8 + (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * local_cb0) =
                 local_3e8.fElem
                 [local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * 6 + lVar16] *
                 local_bf0.fElem[lVar13] +
                 local_610.fElem[6] *
                 *(double *)
                  ((long)local_9c8.fElem +
                  lVar16 * 8 +
                  local_9c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * local_ce8);
            lVar16 = lVar16 + 1;
          } while (lVar16 == 1);
          local_d00 = local_d00 + 1;
          lVar13 = lVar13 + 1;
          local_ce8 = local_ce8 + 8;
          local_cb0 = local_cb0 + 8;
        } while (lVar13 != lVar10);
      }
      TPZFMatrix<double>::~TPZFMatrix(&local_9c8,&PTR_PTR_0185f328);
      TPZFMatrix<double>::~TPZFMatrix(&local_bf0,&PTR_PTR_018e0e30);
    }
    TPZFMatrix<double>::~TPZFMatrix(&local_3e8,&PTR_PTR_0185f328);
    TPZFMatrix<double>::~TPZFMatrix(&local_610,&PTR_PTR_018e0e30);
  }
  return;
}

Assistant:

void TPZShapeTriang::Shape(TPZVec<REAL> &pt, TPZVec<int64_t> &id, TPZVec<int> &order,
							   TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
		ShapeCorner(pt,phi,dphi);
		if (order[0] < 2 && order[1] < 2 && order[2] < 2 && order[3] < 3) return;
		int is,d;
    
        TPZFNMatrix<50,REAL> phiblend(NSides,1);
        TPZFNMatrix<100,REAL> dphiblend(Dimension,NSides);
		for(is=0; is<NCornerNodes; is++)
		{
			phiblend(is,0) = phi(is,0);
			for(d=0; d<Dimension; d++)
			{
				dphiblend(d,is) = dphi(d,is);
			}
		}
		ShapeGenerating(pt,phiblend,dphiblend);
		
		REAL out;
		int shape = 3;
		for (int rib = 0; rib < 3; rib++) {
			
			ProjectPoint2dTriangToRib(rib,pt,out);
			TPZManVector<REAL,1> outvec(1,out);
			TPZVec<int64_t> ids(2);
			ids[0] = id[rib%3];
			ids[1] = id[(rib+1)%3];
			int ord2 = order[rib]-1;//numero de shapes por lado rib
            TPZFNMatrix<50,REAL> phin(ord2,1);
            TPZFNMatrix<100,REAL>dphin(2,ord2);
			TPZShapeLinear *shplin=0;
			shplin->ShapeInternal(outvec,order[rib],phin,dphin,shplin->GetTransformId1d(ids));
//            dphin.Print("dphin= ",std::cout,EMathematicaInput);
			TransformDerivativeFromRibToTriang(rib,ord2,dphin);
			for (int i = 0; i < ord2; i++) {
				phi(shape,0) = phiblend(rib+3,0)*phin(i,0);
				for(int xj=0;xj<2;xj++) {
					dphi(xj,shape) = dphiblend(xj,rib+3)* phin( i, 0)+
					phiblend(rib+3, 0 )* dphin(xj,i);
				}
				shape++;
			}
		}
        
		if (order[3] < 3) return;//ordem na face
		int ord =  order[3]-2;//num de shapes da face
		int nsh = (ord*(ord+1))/2;
        TPZFNMatrix<50,REAL> phin(nsh,1);
        TPZFNMatrix<100,REAL> dphin(2,nsh);
		ShapeInternal(pt,order[3]-2, phin, dphin,GetTransformId2dT(id));
//         dphin.Print("dphin= ",std::cout,EMathematicaInput);
        
		for(int i=0;i<nsh;i++)	{//number of internal shape equal maximal order
			phi(shape,0) = phiblend(6,0)*phin(i,0);
			for(int d=0;d<2;d++) {
				dphi(d,shape) = dphiblend(d,6)* phin(i,0) +
				phiblend(6,0)*dphin(d,i);
			}
			shape++;
		}
	}